

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

void __thiscall
icu_63::RegexMatcher::RegexMatcher
          (RegexMatcher *this,UText *regexp,UText *input,uint32_t flags,UErrorCode *status)

{
  RegexPattern *pRVar1;
  UParseError pe;
  UParseError local_70;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__RegexMatcher_00475ca8;
  init(this,(EVP_PKEY_CTX *)status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar1 = RegexPattern::compile(regexp,flags,&local_70,status);
    this->fPatternOwned = pRVar1;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      this->fPattern = pRVar1;
      init2(this,input,status);
    }
  }
  return;
}

Assistant:

RegexMatcher::RegexMatcher(UText *regexp, UText *input,
                           uint32_t flags, UErrorCode &status) {
    init(status);
    if (U_FAILURE(status)) {
        return;
    }
    UParseError    pe;
    fPatternOwned      = RegexPattern::compile(regexp, flags, pe, status);
    if (U_FAILURE(status)) {
        return;
    }

    fPattern           = fPatternOwned;
    init2(input, status);
}